

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_rsa_asn1.cc
# Opt level: O2

rsa_st * EVP_PKEY_get1_RSA(EVP_PKEY *pkey)

{
  RSA *r;
  
  r = EVP_PKEY_get0_RSA((EVP_PKEY *)pkey);
  if (r != (RSA *)0x0) {
    RSA_up_ref((RSA *)r);
  }
  return (rsa_st *)r;
}

Assistant:

RSA *EVP_PKEY_get1_RSA(const EVP_PKEY *pkey) {
  RSA *rsa = EVP_PKEY_get0_RSA(pkey);
  if (rsa != NULL) {
    RSA_up_ref(rsa);
  }
  return rsa;
}